

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int str_gsub(lua_State *L)

{
  char cVar1;
  byte bVar2;
  StkId pTVar3;
  lua_State *L_00;
  uint uVar4;
  int iVar5;
  TValue *o1;
  char *s;
  char *pcVar6;
  char *e;
  char *pcVar7;
  ushort **ppuVar8;
  StkId o;
  TValue *key;
  TValue *pTVar9;
  ulong uVar10;
  int iVar12;
  bool bVar13;
  size_t srcl;
  size_t l;
  MatchState ms;
  char *local_22a0;
  size_t local_2298;
  ulong local_2290;
  lua_State *local_2288;
  char *local_2280;
  size_t local_2278;
  lua_Integer local_2270;
  MatchState local_2268;
  luaL_Buffer local_2048;
  ulong uVar11;
  
  s = luaL_checklstring(L,1,&local_2298);
  bVar13 = false;
  pcVar6 = luaL_checklstring(L,2,(size_t *)0x0);
  pTVar9 = L->base + 2;
  if (pTVar9 != &luaO_nilobject_ && pTVar9 < L->top) {
    bVar13 = L->base[2].tt - 3U < 4;
  }
  local_2270 = luaL_optinteger(L,4,local_2298 + 1);
  cVar1 = *pcVar6;
  if (!bVar13) {
    luaL_argerror(L,3,"string/function/table expected");
  }
  pcVar6 = pcVar6 + (cVar1 == '^');
  local_2048.p = local_2048.buffer;
  local_2048.lvl = 0;
  local_2268.src_end = s + local_2298;
  iVar12 = 0;
  local_22a0 = "no value";
  local_2288 = L;
  local_2280 = pcVar6;
  local_2268.src_init = s;
  local_2268.L = L;
  local_2048.L = L;
  do {
    e = s;
    if ((int)local_2270 <= iVar12) break;
    local_2268.level = 0;
    e = match(&local_2268,s,pcVar6);
    L_00 = local_2268.L;
    if (e == (char *)0x0) {
LAB_001130a9:
      e = s;
      if (local_2268.src_end <= s) break;
      if ((&stack0xffffffffffffffd0 <= local_2048.p) &&
         (iVar5 = emptybuffer(&local_2048), iVar5 != 0)) {
        adjuststack(&local_2048);
      }
      e = s + 1;
      *local_2048.p = *s;
      local_2048.p = local_2048.p + 1;
    }
    else {
      pTVar9 = (local_2268.L)->top;
      pTVar3 = (local_2268.L)->base;
      if (pTVar3 + 2 == &luaO_nilobject_ || pTVar9 <= pTVar3 + 2) {
LAB_00112e9e:
        iVar5 = L_00->top[-1].tt;
        pTVar9 = L_00->top + -1;
        if (((long)iVar5 == 0) || ((iVar5 == 1 && ((pTVar9->value).b == 0)))) {
          L_00->top = pTVar9;
          lua_pushlstring(L_00,s,(long)e - (long)s);
        }
        else {
          if (pTVar9 == &luaO_nilobject_) {
LAB_001131d0:
            luaL_error(L_00,"invalid replacement value (a %s)",local_22a0);
          }
          if (iVar5 - 5U < 0xfffffffe) {
            if (iVar5 != -1) {
              local_22a0 = luaT_typenames[iVar5];
            }
            goto LAB_001131d0;
          }
        }
        luaL_addvalue(&local_2048);
      }
      else {
        iVar5 = pTVar3[2].tt;
        if (1 < iVar5 - 3U) {
          if (iVar5 == 5) {
            push_onecapture(&local_2268,0,s,e);
            pTVar9 = L_00->base + 2;
            if (L_00->top <= pTVar9) {
              pTVar9 = &luaO_nilobject_;
            }
            key = L_00->top + -1;
            luaV_gettable(L_00,pTVar9,key,key);
          }
          else if (iVar5 == 6) {
            pTVar9->value = pTVar3[2].value;
            pTVar9->tt = pTVar3[2].tt;
            (local_2268.L)->top = (local_2268.L)->top + 1;
            uVar4 = push_captures(&local_2268,s,e);
            luaD_call(L_00,L_00->top + (int)~uVar4,1);
          }
          goto LAB_00112e9e;
        }
        pcVar7 = lua_tolstring(local_2268.L,3,&local_2290);
        pcVar6 = local_2280;
        if (local_2290 != 0) {
          local_2278 = (long)e - (long)s;
          uVar10 = 0;
          do {
            if (pcVar7[uVar10] == '%') {
              uVar11 = uVar10 + 1;
              ppuVar8 = __ctype_b_loc();
              bVar2 = pcVar7[uVar10 + 1];
              if ((*(byte *)((long)*ppuVar8 + (ulong)bVar2 * 2 + 1) & 8) == 0) {
                if ((&stack0xffffffffffffffd0 <= local_2048.p) &&
                   (iVar5 = emptybuffer(&local_2048), iVar5 != 0)) {
                  adjuststack(&local_2048);
                }
                *local_2048.p = pcVar7[uVar11];
                local_2048.p = local_2048.p + 1;
              }
              else if (bVar2 == 0x30) {
                luaL_addlstring(&local_2048,s,local_2278);
              }
              else {
                push_onecapture(&local_2268,(char)bVar2 + -0x31,s,e);
                luaL_addvalue(&local_2048);
              }
            }
            else {
              if ((&stack0xffffffffffffffd0 <= local_2048.p) &&
                 (iVar5 = emptybuffer(&local_2048), iVar5 != 0)) {
                adjuststack(&local_2048);
              }
              *local_2048.p = pcVar7[uVar10];
              uVar11 = uVar10;
              local_2048.p = local_2048.p + 1;
            }
            uVar10 = uVar11 + 1;
            pcVar6 = local_2280;
          } while (uVar10 < local_2290);
        }
      }
      iVar12 = iVar12 + 1;
      if (e <= s) goto LAB_001130a9;
    }
    s = e;
  } while (cVar1 != '^');
  luaL_addlstring(&local_2048,e,(long)local_2268.src_end - (long)e);
  emptybuffer(&local_2048);
  lua_concat(local_2048.L,local_2048.lvl);
  pTVar3 = local_2288->top;
  (pTVar3->value).n = (double)iVar12;
  pTVar3->tt = 3;
  local_2288->top = local_2288->top + 1;
  return 2;
}

Assistant:

static int str_gsub(lua_State*L){
size_t srcl;
const char*src=luaL_checklstring(L,1,&srcl);
const char*p=luaL_checkstring(L,2);
int tr=lua_type(L,3);
int max_s=luaL_optint(L,4,srcl+1);
int anchor=(*p=='^')?(p++,1):0;
int n=0;
MatchState ms;
luaL_Buffer b;
luaL_argcheck(L,tr==3||tr==4||
tr==6||tr==5,3,
"string/function/table expected");
luaL_buffinit(L,&b);
ms.L=L;
ms.src_init=src;
ms.src_end=src+srcl;
while(n<max_s){
const char*e;
ms.level=0;
e=match(&ms,src,p);
if(e){
n++;
add_value(&ms,&b,src,e);
}
if(e&&e>src)
src=e;
else if(src<ms.src_end)
luaL_addchar(&b,*src++);
else break;
if(anchor)break;
}
luaL_addlstring(&b,src,ms.src_end-src);
luaL_pushresult(&b);
lua_pushinteger(L,n);
return 2;
}